

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

bool __thiscall EntryUnpacker::operator()(EntryUnpacker *this,EntryKey *entryKey)

{
  pointer pcVar1;
  VolumeFile *pVVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  string entryPath;
  path fullEntryPath;
  EntryBTree childEntryBtree;
  EntryUnpacker childUnpacker;
  NodeKey nodeKey;
  NodeBTree nodeBtree;
  string local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [24];
  _func_int **local_f8;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  bool local_60;
  locale local_58;
  NodeKey local_50;
  BTree<NodeBTree,_NodeKey> local_38 [2];
  
  VolumeFile::getEntryPath(&local_190,this->m_volume,entryKey,&this->m_parentDirectory);
  if (local_190._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot determine entry path.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    bVar3 = false;
    goto LAB_00120e92;
  }
  pVVar2 = (VolumeFile *)(local_130 + 0x10);
  pcVar1 = (this->m_outDirectory->_M_dataplus)._M_p;
  local_130._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + this->m_outDirectory->_M_string_length);
  local_150._0_8_ = &local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  boost::filesystem::path::operator/=((path *)local_130,(path *)local_150);
  local_170._8_8_ = local_130._8_8_;
  if ((VolumeFile *)local_130._0_8_ == pVVar2) {
    local_160._8_8_ = local_120._8_8_;
    local_170._M_allocated_capacity = (size_type)(VolumeFile *)local_160;
  }
  else {
    local_170._M_allocated_capacity = local_130._0_8_;
  }
  local_160._0_8_ = local_120._M_allocated_capacity;
  local_130._8_8_ = (pointer)0x0;
  local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
  local_130._0_8_ = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
    if ((VolumeFile *)local_130._0_8_ != pVVar2) {
      operator_delete((void *)local_130._0_8_,(ulong)(local_120._M_allocated_capacity + 1));
    }
  }
  if ((entryKey->m_flags & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FILE:",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_190._M_dataplus._M_p,local_190._M_string_length)
    ;
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pVVar2 = this->m_volume;
    local_38[0].m_data =
         (pVVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + pVVar2->m_nodeTreeOffset;
    local_38[1].m_data._0_1_ =
         1 < (ulong)(((long)(pVVar2->m_dataStreams).
                            super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pVVar2->m_dataStreams).
                            super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x14c1bacf914c1bad);
    local_50.m_nodeIndex = entryKey->m_linkIndex;
    local_50.m_flags = 0;
    local_50.m_size1 = 0;
    local_50.m_size2 = 0;
    local_50.m_volumeIndex = 0xffffffff;
    local_50.m_sectorIndex = 0;
    uVar4 = BTree<NodeBTree,_NodeKey>::searchByKey(local_38,&local_50);
    if (uVar4 != 0xffffffff) {
      bVar3 = VolumeFile::unpackNode(this->m_volume,&local_50,(string *)&local_170);
      if (bVar3) goto LAB_00120e79;
    }
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
               "Cannot unpack node: %s");
    local_150._0_8_ = &local_170;
    local_150._8_8_ =
         boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
    local_140._M_allocated_capacity =
         (size_type)
         boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
    f = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   (put_holder<char,_std::char_traits<char>_> *)local_150);
    pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,f);
    std::ios::widen((char)pbVar6->_vptr_basic_ostream[-3] + (char)pbVar6);
    std::ostream::put((char)pbVar6);
    std::ostream::flush();
    if (local_60 == true) {
      std::locale::~locale(&local_58);
      local_60 = false;
    }
    boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_altstringbuf(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
    }
    if ((void *)local_120._8_8_ != (void *)0x0) {
      operator_delete((void *)local_120._8_8_,(long)local_f8 - local_120._8_8_);
      local_120._8_8_ = (void *)0x0;
      local_110._0_4_ = 0;
      local_110._8_8_ = (_Bit_type *)0x0;
      local_110._16_4_ = 0;
      local_f8 = (_func_int **)0x0;
    }
    std::
    vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_130);
    bVar3 = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DIR:",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_190._M_dataplus._M_p,local_190._M_string_length)
    ;
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    boost::filesystem::detail::create_directories((path *)&local_170,(error_code *)0x0);
    local_130._0_8_ = this->m_volume;
    local_150._0_8_ =
         (ulong)*(uint *)((long)(((VolumeFile *)local_130._0_8_)->m_entryTreeOffsets).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         (ulong)entryKey->m_linkIndex * 4) +
         (long)(((VolumeFile *)local_130._0_8_)->m_data).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_130._8_8_ = this->m_outDirectory;
    local_120._M_allocated_capacity = (size_type)local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_130 + 0x10),local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
              ((BTree<EntryBTree,EntryKey> *)local_150,(EntryUnpacker *)local_130);
    if ((undefined1 *)local_120._M_allocated_capacity != local_110) {
      operator_delete((void *)local_120._M_allocated_capacity,
                      CONCAT44(local_110._4_4_,local_110._0_4_) + 1);
    }
LAB_00120e79:
    bVar3 = true;
  }
  if ((VolumeFile *)local_170._M_allocated_capacity != (VolumeFile *)local_160) {
    operator_delete((void *)local_170._M_allocated_capacity,(ulong)(local_160._0_8_ + 1));
  }
LAB_00120e92:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool operator ()(const EntryKey& entryKey) const
	{
		const auto entryPath = m_volume.getEntryPath(entryKey, m_parentDirectory);
		if (entryPath.empty()) {
			std::cerr << "Cannot determine entry path." << std::endl;
			return false;
		}
		
		const auto fullEntryPath = boost::filesystem::path(m_outDirectory) / entryPath;
		
		if (entryKey.isDirectory()) {
			std::cout << "DIR:" << entryPath << std::endl;
			//entryKey.dump();
			
			boost::filesystem::create_directories(fullEntryPath);
			
			const EntryBTree childEntryBtree(
				advancePointer(m_volume.data().data(), m_volume.entryTreeOffset(entryKey.linkIndex()))
			);
			const EntryUnpacker childUnpacker(m_volume, m_outDirectory, entryPath);
			childEntryBtree.traverse(childUnpacker);
		} else {
			std::cout << "FILE:" << entryPath << std::endl;
			//entryKey.dump();
			
			const NodeBTree nodeBtree(
				advancePointer(m_volume.data().data(), m_volume.nodeTreeOffset()),
				m_volume.hasMultipleVolumes()
			);
			NodeKey nodeKey(entryKey.linkIndex());
			const auto nodeIndex = nodeBtree.searchByKey(nodeKey);
			bool unpacked = false;
			if (nodeIndex != NodeBTree::INVALID_INDEX) {
				if (m_volume.unpackNode(nodeKey, fullEntryPath.string())) {
					unpacked = true;
				}
			}
			if (!unpacked) {
				std::cerr << boost::format("Cannot unpack node: %s") % fullEntryPath.string() << std::endl;
				return false;
			}
		}

		return true;
	}